

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_done(connectdata *conn,CURLcode status,_Bool premature)

{
  undefined1 *puVar1;
  Curl_easy *data;
  void *pvVar2;
  undefined8 *puVar3;
  Curl_send_buffer *in;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  puVar1 = &(data->state).authhost.field_0x18;
  *puVar1 = *puVar1 & 0xfd;
  puVar1 = &(data->state).authproxy.field_0x18;
  *puVar1 = *puVar1 & 0xfd;
  Curl_unencode_cleanup(conn);
  conn->seek_func = (data->set).seek_func;
  conn->seek_client = (data->set).seek_client;
  if (pvVar2 != (void *)0x0) {
    puVar3 = *(undefined8 **)((long)pvVar2 + 0x210);
    if (puVar3 != (undefined8 *)0x0) {
      (*Curl_cfree)((void *)*puVar3);
      (*Curl_cfree)(puVar3);
      *(undefined8 *)((long)pvVar2 + 0x210) = 0;
    }
    Curl_mime_cleanpart((curl_mimepart *)((long)pvVar2 + 0x28));
    if (status != CURLE_OK || premature) {
      return status;
    }
    if ((((conn->bits).field_0x5 & 0x20) == 0) && (((data->set).field_0x87c & 0x20) == 0)) {
      if ((data->req).deductheadercount < (data->req).headerbytecount + (data->req).bytecount) {
        return CURLE_OK;
      }
      Curl_failf(data,"Empty reply from server");
      return CURLE_GOT_NOTHING;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_done(struct connectdata *conn,
                        CURLcode status, bool premature)
{
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;

  /* Clear multipass flag. If authentication isn't done yet, then it will get
   * a chance to be set back to true when we output the next auth header */
  data->state.authhost.multipass = FALSE;
  data->state.authproxy.multipass = FALSE;

  Curl_unencode_cleanup(conn);

  /* set the proper values (possibly modified on POST) */
  conn->seek_func = data->set.seek_func; /* restore */
  conn->seek_client = data->set.seek_client; /* restore */

  if(!http)
    return CURLE_OK;

  if(http->send_buffer) {
    Curl_add_buffer_free(&http->send_buffer);
  }

  Curl_http2_done(conn, premature);

  Curl_mime_cleanpart(&http->form);

  if(status)
    return status;

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     (data->req.bytecount +
      data->req.headerbytecount -
      data->req.deductheadercount) <= 0) {
    /* If this connection isn't simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this can't be right so we
       return an error here */
    failf(data, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}